

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StartThreadRazorAHRSx(RAZORAHRS *pRazorAHRS)

{
  int iVar1;
  int iVar2;
  long lVar3;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  __mutex = RazorAHRSCS;
  pThreadId = RazorAHRSThreadId;
  lVar3 = 0;
  do {
    if (*(RAZORAHRS **)((long)addrsRazorAHRS + lVar3 * 2) == pRazorAHRS) {
      *(undefined4 *)((long)resRazorAHRS + lVar3) = 1;
      *(undefined4 *)((long)bExitRazorAHRS + lVar3) = 0;
      razorahrsdataRazorAHRS[0].yaw = 0.0;
      razorahrsdataRazorAHRS[0].pitch = 0.0;
      razorahrsdataRazorAHRS[0].roll = 0.0;
      razorahrsdataRazorAHRS[0].accx = 0.0;
      razorahrsdataRazorAHRS[0].accy = 0.0;
      razorahrsdataRazorAHRS[0].accz = 0.0;
      razorahrsdataRazorAHRS[0].gyrx = 0.0;
      razorahrsdataRazorAHRS[0].gyry = 0.0;
      razorahrsdataRazorAHRS[0].gyrz = 0.0;
      razorahrsdataRazorAHRS[0].Roll = 0.0;
      razorahrsdataRazorAHRS[0].Pitch = 0.0;
      razorahrsdataRazorAHRS[0].Yaw = 0.0;
      iVar1 = pthread_mutexattr_init(&local_2c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype(&local_2c,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,&local_2c);
          iVar2 = pthread_mutexattr_destroy(&local_2c);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          }
        }
        else {
          pthread_mutexattr_destroy(&local_2c);
        }
      }
      iVar1 = CreateDefaultThread(RazorAHRSThread,pRazorAHRS,pThreadId);
      return iVar1;
    }
    lVar3 = lVar3 + 4;
    __mutex = __mutex + 1;
    pThreadId = pThreadId + 1;
  } while (lVar3 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadRazorAHRSx(RAZORAHRS* pRazorAHRS)
{
	int id = 0;

	while (addrsRazorAHRS[id] != pRazorAHRS)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resRazorAHRS[id] = EXIT_FAILURE;
	bExitRazorAHRS[id] = FALSE;
	memset(&razorahrsdataRazorAHRS, 0, sizeof(RAZORAHRSDATA));
	InitCriticalSection(&RazorAHRSCS[id]);
	return CreateDefaultThread(RazorAHRSThread, (void*)pRazorAHRS, &RazorAHRSThreadId[id]);
}